

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O2

void __thiscall
duckdb::LateMaterialization::ReplaceTopLevelTableIndex
          (LateMaterialization *this,LogicalOperator *root,idx_t new_index)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  pointer pBVar2;
  type pEVar3;
  LogicalTopN *pLVar4;
  reference this_00;
  LogicalGet *pLVar5;
  InternalException *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_02;
  pointer pBVar6;
  allocator local_51;
  string local_50;
  
  do {
    switch(root->type) {
    case LOGICAL_PROJECTION:
      pLVar5 = (LogicalGet *)LogicalOperator::Cast<duckdb::LogicalProjection>(root);
LAB_0125adfe:
      pLVar5->table_index = new_index;
      return;
    case LOGICAL_FILTER:
    case LOGICAL_LIMIT:
    case LOGICAL_SAMPLE:
      puVar1 = (root->expressions).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_02 = (root->expressions).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1;
          this_02 = this_02 + 1) {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_02);
        ReplaceTableReferences(this,pEVar3,new_index);
      }
      break;
    case LOGICAL_AGGREGATE_AND_GROUP_BY:
    case LOGICAL_WINDOW:
    case LOGICAL_UNNEST:
    case LOGICAL_ORDER_BY:
    case LOGICAL_TOP_N|LOGICAL_PROJECTION:
    case LOGICAL_COPY_TO_FILE:
    case LOGICAL_DISTINCT:
      goto switchD_0125ad6b_caseD_3;
    case LOGICAL_TOP_N:
      pLVar4 = LogicalOperator::Cast<duckdb::LogicalTopN>(root);
      pBVar2 = (pLVar4->orders).
               super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
               super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar6 = (pLVar4->orders).
                    super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    .
                    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar2; pBVar6 = pBVar6 + 1
          ) {
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&pBVar6->expression);
        ReplaceTableReferences(this,pEVar3,new_index);
      }
      break;
    default:
      if (root->type != LOGICAL_GET) {
switchD_0125ad6b_caseD_3:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Unsupported operator type in LateMaterialization::ReplaceTopLevelTableIndex",
                   &local_51);
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pLVar5 = LogicalOperator::Cast<duckdb::LogicalGet>(root);
      goto LAB_0125adfe;
    }
    this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&root->children,0);
    root = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(this_00);
  } while( true );
}

Assistant:

void LateMaterialization::ReplaceTopLevelTableIndex(LogicalOperator &root, idx_t new_index) {
	reference<LogicalOperator> current_op = root;
	while (true) {
		auto &op = current_op.get();
		switch (op.type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			// reached a projection - modify the table index and return
			auto &proj = op.Cast<LogicalProjection>();
			proj.table_index = new_index;
			return;
		}
		case LogicalOperatorType::LOGICAL_GET: {
			// reached the root get - modify the table index and return
			auto &get = op.Cast<LogicalGet>();
			get.table_index = new_index;
			return;
		}
		case LogicalOperatorType::LOGICAL_TOP_N: {
			// visit the expressions of the operator and continue into the child node
			auto &top_n = op.Cast<LogicalTopN>();
			for (auto &order : top_n.orders) {
				ReplaceTableReferences(*order.expression, new_index);
			}
			current_op = *op.children[0];
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER:
		case LogicalOperatorType::LOGICAL_SAMPLE:
		case LogicalOperatorType::LOGICAL_LIMIT: {
			// visit the expressions of the operator and continue into the child node
			for (auto &expr : op.expressions) {
				ReplaceTableReferences(*expr, new_index);
			}
			current_op = *op.children[0];
			break;
		}
		default:
			throw InternalException("Unsupported operator type in LateMaterialization::ReplaceTopLevelTableIndex");
		}
	}
}